

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

int __thiscall SpeciesTracker::species(SpeciesTracker *this,string *reactant)

{
  size_type sVar1;
  runtime_error *this_00;
  mapped_type_conflict *pmVar2;
  string *reactant_local;
  SpeciesTracker *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count(&this->species_,reactant);
  if (sVar1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Species not found in tracker.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->species_,reactant);
  return *pmVar2;
}

Assistant:

int SpeciesTracker::species(const std::string &reactant) {
  if (species_.count(reactant) == 0) {
    throw std::runtime_error("Species not found in tracker.");
  }
  return species_[reactant];
}